

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

void __thiscall SQLexer::LexBlockComment(SQLexer *this)

{
  LexChar LVar1;
  
  do {
    while (LVar1 = this->_currdata, LVar1 == '\0') {
      (*this->_errfunc)(this->_errtarget,"missing \"*/\" in comment");
LAB_0011e5ba:
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
    }
    if (LVar1 == '\n') {
      this->_currentline = this->_currentline + 1;
      goto LAB_0011e5ba;
    }
    if (LVar1 != '*') goto LAB_0011e5ba;
    Next(this);
    this->_currentcolumn = this->_currentcolumn + 1;
    if (this->_currdata == '/') {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      return;
    }
  } while( true );
}

Assistant:

void SQLexer::LexBlockComment()
{
    bool done = false;
    while(!done) {
        switch(CUR_CHAR) {
            case _SC('*'): { NEXT(); if(CUR_CHAR == _SC('/')) { done = true; NEXT(); }}; continue;
            case _SC('\n'): _currentline++; NEXT(); continue;
            case SQUIRREL_EOB: Error(_SC("missing \"*/\" in comment"));
            default: NEXT();
        }
    }
}